

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfLogicCofVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  word *pwVar1;
  word *pwVar2;
  ulong *puVar3;
  uint uVar4;
  byte bVar5;
  char cVar6;
  int iVar7;
  uint nVars;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  word *pIn;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  int iVar15;
  ulong uVar16;
  word *pwVar17;
  long lVar18;
  uint uVar19;
  uint nVars_00;
  word *pwVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  int iLitCofs [3];
  int pVarsNew [16];
  word pTruthCof [128];
  
  pIn = If_CutTruthW(pIfMan,pCutBest);
  uVar4 = *(uint *)&pCutBest->field_0x1c;
  uVar19 = uVar4 >> 0x18;
  iVar12 = 1 << ((char)(uVar4 >> 0x18) - 6U & 0x1f);
  if (uVar4 < 0x7000000) {
    iVar12 = 1;
  }
  iVar7 = Abc_Lit2Var(pCutBest->iCutFunc);
  cVar6 = Vec_StrEntry(pIfMan->vTtVars[uVar19],iVar7);
  if (((cVar6 < '\0') || (iVar7 = (int)cVar6, (int)uVar19 <= iVar7)) ||
     (0xd < pIfMan->pPars->nLutSize)) {
    __assert_fail("iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x650,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
    for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
      pVarsNew[uVar13] = (int)uVar13;
    }
    if (lVar18 == 0) {
      Abc_TtCofactor0p(pTruthCof,pIn,iVar12,iVar7);
    }
    else {
      Abc_TtCofactor1p(pTruthCof,pIn,iVar12,iVar7);
    }
    uVar4 = *(uint *)&pCutBest->field_0x1c;
    uVar22 = uVar4 >> 0x18;
    nVars = 6;
    if (6 < uVar22) {
      nVars = uVar22;
    }
    uVar8 = 1 << ((char)nVars - 6U & 0x1f);
    uVar23 = 0;
    uVar13 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar13 = uVar23;
    }
    nVars_00 = 0;
    for (; uVar23 != uVar22; uVar23 = uVar23 + 1) {
      bVar5 = (byte)uVar23;
      if (uVar4 < 0x7000000) {
        if ((s_Truths6Neg[uVar23] &
            (pTruthCof[0] >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ pTruthCof[0])) != 0) {
LAB_005a9091:
          if ((long)(int)nVars_00 < (long)uVar23) {
            pVarsNew[(int)nVars_00] = pVarsNew[uVar23];
            Abc_TtSwapVars(pTruthCof,nVars,nVars_00,(int)uVar23);
          }
          nVars_00 = nVars_00 + 1;
        }
      }
      else {
        if (uVar23 < 6) {
          uVar16 = 0;
          do {
            if (uVar13 == uVar16) goto LAB_005a90bd;
            puVar3 = pTruthCof + uVar16;
            uVar16 = uVar16 + 1;
          } while ((s_Truths6Neg[uVar23] &
                   (*puVar3 >> ((byte)(1 << (bVar5 & 0x1f)) & 0x3f) ^ *puVar3)) == 0);
          goto LAB_005a9091;
        }
        uVar9 = 1 << (bVar5 - 6 & 0x1f);
        iVar15 = 2 << (bVar5 - 6 & 0x1f);
        uVar16 = 0;
        if (0 < (int)uVar9) {
          uVar16 = (ulong)uVar9;
        }
        pwVar17 = pTruthCof + (int)uVar9;
        for (pwVar20 = pTruthCof; pwVar20 < pTruthCof + (int)uVar8; pwVar20 = pwVar20 + iVar15) {
          uVar21 = 0;
          while (uVar16 != uVar21) {
            pwVar1 = pwVar20 + uVar21;
            pwVar2 = pwVar17 + uVar21;
            uVar21 = uVar21 + 1;
            if (*pwVar1 != *pwVar2) goto LAB_005a9091;
          }
          pwVar17 = pwVar17 + iVar15;
        }
      }
LAB_005a90bd:
    }
    if ((int)uVar22 < (int)nVars_00) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilTruth.h"
                    ,0x5c4,"int Abc_TtMinBase(word *, int *, int, int)");
    }
    vLeaves2->nSize = 0;
    uVar13 = 0;
    if (0 < (int)nVars_00) {
      uVar13 = (ulong)nVars_00;
    }
    for (uVar23 = 0; uVar13 != uVar23; uVar23 = uVar23 + 1) {
      iVar15 = Vec_IntEntry(vLeaves,pVarsNew[uVar23]);
      Vec_IntPush(vLeaves2,iVar15);
    }
    iVar15 = Kit_TruthToGia(pNew,(uint *)pTruthCof,nVars_00,vCover,vLeaves2,0);
    iLitCofs[lVar18] = iVar15;
    if (1 < (int)nVars_00) {
      iVar10 = Abc_Lit2Var(iVar15);
      pGVar14 = Gia_ManObj(pNew,iVar10);
      if (((int)(uint)*(undefined8 *)pGVar14 < 0) ||
         (((uint)*(undefined8 *)pGVar14 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x662,
                      "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar10 = Abc_Lit2Var(iVar15);
      Vec_IntSetEntry(vMapping,iVar10,vMapping2->nSize);
      Vec_IntPush(vMapping2,vLeaves2->nSize);
      for (iVar10 = 0; iVar10 < vLeaves2->nSize; iVar10 = iVar10 + 1) {
        iVar11 = Vec_IntEntry(vLeaves2,iVar10);
        iVar11 = Abc_Lit2Var(iVar11);
        Vec_IntPush(vMapping2,iVar11);
      }
      iVar15 = Abc_Lit2Var(iVar15);
      Vec_IntPush(vMapping2,iVar15);
    }
  }
  iVar12 = Vec_IntEntry(vLeaves,iVar7);
  iLitCofs[2] = iVar12;
  if (1 < iLitCofs[1] && 1 < iLitCofs[0]) {
    pTruthCof[0] = 0xcacacacacacacaca;
    vLeaves2->nSize = 0;
    Vec_IntPush(vLeaves2,iLitCofs[0]);
    Vec_IntPush(vLeaves2,iLitCofs[1]);
    Vec_IntPush(vLeaves2,iVar12);
    iVar12 = Kit_TruthToGia(pNew,(uint *)pTruthCof,vLeaves2->nSize,vCover,vLeaves2,0);
    iVar7 = iVar12;
    goto LAB_005a9375;
  }
  if (iLitCofs[0] < 2 && iLitCofs[1] < 2) {
    __assert_fail("iLitCofs[0] > 1 || iLitCofs[1] > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x677,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  vLeaves2->nSize = 0;
  for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
    if (1 < iLitCofs[lVar18]) {
      Vec_IntPush(vLeaves2,iLitCofs[lVar18]);
    }
  }
  if (vLeaves2->nSize != 2) {
    __assert_fail("Vec_IntSize(vLeaves2) == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x67d,
                  "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  if (iLitCofs[0] == 1) {
    iVar7 = Abc_LitNot(iVar12);
    iLitCofs[0] = iLitCofs[1];
LAB_005a9370:
    iVar7 = Gia_ManAppendOr(pNew,iVar7,iLitCofs[0]);
  }
  else {
    iVar7 = iVar12;
    if (iLitCofs[0] != 0) {
      if (iLitCofs[1] == 1) goto LAB_005a9370;
      if (iLitCofs[1] != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x687,
                      "int Gia_ManFromIfLogicCofVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar7 = Abc_LitNot(iVar12);
      iLitCofs[1] = iLitCofs[0];
    }
    iVar7 = Gia_ManAppendAnd(pNew,iVar7,iLitCofs[1]);
  }
LAB_005a9375:
  iVar15 = Abc_Lit2Var(iVar7);
  Vec_IntSetEntry(vMapping,iVar15,vMapping2->nSize);
  Vec_IntPush(vMapping2,vLeaves2->nSize);
  for (iVar15 = 0; iVar15 < vLeaves2->nSize; iVar15 = iVar15 + 1) {
    iVar10 = Vec_IntEntry(vLeaves2,iVar15);
    iVar10 = Abc_Lit2Var(iVar10);
    Vec_IntPush(vMapping2,iVar10);
  }
  iVar12 = Abc_Lit2Var(iVar12);
  Vec_IntPush(vMapping2,-iVar12);
  iVar12 = Abc_LitNotCond(iVar7,*(uint *)&pCutBest->field_0x1c >> 0xc & 1);
  return iVar12;
}

Assistant:

int Gia_ManFromIfLogicCofVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pTruthCof[128], * pTruth = If_CutTruthW(pIfMan, pCutBest);
    int pVarsNew[16], nVarsNew, iLitCofs[3]; 
    int nLeaves = pCutBest->nLeaves;
    int nWords  = Abc_Truth6WordNum(nLeaves);
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, iVar = Vec_StrEntry(pIfMan->vTtVars[nLeaves], truthId), iTemp, iTopLit;
    int k, RetValue = -1;
    assert( iVar >= 0 && iVar < nLeaves && pIfMan->pPars->nLutSize <= 13 );
    for ( c = 0; c < 2; c++ )
    {
        for ( k = 0; k < nLeaves; k++ )
            pVarsNew[k] = k;
        if ( c )
            Abc_TtCofactor1p( pTruthCof, pTruth, nWords, iVar );
        else
            Abc_TtCofactor0p( pTruthCof, pTruth, nWords, iVar );
        nVarsNew = Abc_TtMinBase( pTruthCof, pVarsNew, pCutBest->nLeaves, Abc_MaxInt(6, pCutBest->nLeaves) );
        // derive LUT
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nVarsNew; k++ )
            Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, pVarsNew[k]) );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, nVarsNew, vCover, vLeaves2, 0 );
        if ( nVarsNew < 2 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[2]  = Vec_IntEntry(vLeaves, iVar);
    // derive MUX
    if ( iLitCofs[0] > 1 && iLitCofs[1] > 1 )
    {
        pTruthCof[0] = ABC_CONST(0xCACACACACACACACA);
        Vec_IntClear( vLeaves2 );
        Vec_IntPush( vLeaves2, iLitCofs[0] );
        Vec_IntPush( vLeaves2, iLitCofs[1] );
        Vec_IntPush( vLeaves2, iLitCofs[2] );
        RetValue = Kit_TruthToGia( pNew, (unsigned *)pTruthCof, Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        iTopLit = RetValue;
    }
    else
    {
        assert( iLitCofs[0] > 1 || iLitCofs[1] > 1 );
        // collect leaves
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < 3; k++ )
            if ( iLitCofs[k] > 1 )
                Vec_IntPush( vLeaves2, iLitCofs[k] );
        assert( Vec_IntSize(vLeaves2) == 2 );
        // consider three possibilities
        if ( iLitCofs[0] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, iLitCofs[2], iLitCofs[1] );
        else if ( iLitCofs[0] == 1 )
            RetValue = Gia_ManAppendOr( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[1] );
        else if ( iLitCofs[1] == 0 )
            RetValue = Gia_ManAppendAnd( pNew, Abc_LitNot(iLitCofs[2]), iLitCofs[0] );
        else if ( iLitCofs[1] == 1 )
            RetValue = Gia_ManAppendOr( pNew, iLitCofs[2], iLitCofs[0] );
        else assert( 0 );
        iTopLit = iLitCofs[2];
    }
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
    Vec_IntForEachEntry( vLeaves2, iTemp, k )
        Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(iTopLit) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}